

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O1

void __thiscall RTVector3::accelToEuler(RTVector3 *this,RTVector3 *rollPitchYaw)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float __x;
  float fVar5;
  float fVar6;
  
  fVar4 = this->m_data[0];
  fVar5 = this->m_data[1];
  fVar6 = this->m_data[2];
  fVar3 = fVar6 * fVar6 + fVar4 * fVar4 + fVar5 * fVar5;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  bVar1 = NAN(fVar3);
  bVar2 = fVar3 == 0.0;
  __x = fVar6 / fVar3;
  if ((bVar2) && (!bVar1)) {
    __x = fVar6;
  }
  fVar6 = fVar5 / fVar3;
  if ((bVar2) && (!bVar1)) {
    fVar6 = fVar5;
  }
  fVar5 = fVar4 / fVar3;
  if ((bVar2) && (!bVar1)) {
    fVar5 = fVar4;
  }
  fVar4 = atan2f(fVar6,__x);
  rollPitchYaw->m_data[0] = fVar4;
  fVar4 = fVar6 * fVar6 + __x * __x;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = atan2f(fVar5,fVar4);
  rollPitchYaw->m_data[1] = -fVar4;
  rollPitchYaw->m_data[2] = 0.0;
  return;
}

Assistant:

void RTVector3::accelToEuler(RTVector3& rollPitchYaw) const
{
    RTVector3 normAccel = *this;

    normAccel.normalize();

    rollPitchYaw.setX(atan2(normAccel.y(), normAccel.z()));
    rollPitchYaw.setY(-atan2(normAccel.x(), sqrt(normAccel.y() * normAccel.y() + normAccel.z() * normAccel.z())));
    rollPitchYaw.setZ(0);
}